

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *
duckdb::Catalog::GetSchemas
          (vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *__return_storage_ptr__,
          ClientContext *context,string *catalog_name)

{
  CatalogEntryRetriever retriever;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  ClientContext *local_28;
  undefined8 local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_18;
  undefined8 local_10;
  
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_20 = 0;
  p_Stack_18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_10 = 0;
  local_28 = context;
  GetSchemas(__return_storage_ptr__,(CatalogEntryRetriever *)&local_48,catalog_name);
  if (p_Stack_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_18);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<reference<SchemaCatalogEntry>> Catalog::GetSchemas(ClientContext &context, const string &catalog_name) {
	CatalogEntryRetriever retriever(context);
	return GetSchemas(retriever, catalog_name);
}